

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_0::NetworkAddressImpl::connect
          (NetworkAddressImpl *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  NetworkFilter *filter;
  SocketAddress *pSVar1;
  undefined4 in_register_00000034;
  ArrayDisposer *pAVar2;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs;
  Promise<kj::AuthenticatedStream> local_70 [3];
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> local_58;
  undefined1 local_48 [8];
  Promise<kj::AuthenticatedStream> promise;
  undefined1 local_30 [8];
  Array<kj::(anonymous_namespace)::SocketAddress> addrsCopy;
  NetworkAddressImpl *this_local;
  
  pAVar2 = (ArrayDisposer *)CONCAT44(in_register_00000034,__fd);
  addrsCopy.disposer = pAVar2;
  _promise = Array<kj::(anonymous_namespace)::SocketAddress>::asPtr
                       ((Array<kj::(anonymous_namespace)::SocketAddress> *)(pAVar2 + 3));
  heapArray<kj::(anonymous_namespace)::SocketAddress>
            ((Array<kj::(anonymous_namespace)::SocketAddress> *)local_30,_promise);
  filter = (NetworkFilter *)pAVar2[1]._vptr_ArrayDisposer;
  pSVar1 = (SocketAddress *)pAVar2[2]._vptr_ArrayDisposer;
  local_58 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_30);
  addrs.size_ = (size_t)local_58.ptr;
  addrs.ptr = pSVar1;
  connectImpl((LowLevelAsyncIoProvider *)local_48,filter,addrs,local_58.size_._0_1_);
  mv<kj::Array<kj::(anonymous_namespace)::SocketAddress>>
            ((Array<kj::(anonymous_namespace)::SocketAddress> *)local_30);
  Promise<kj::AuthenticatedStream>::attach<kj::Array<kj::(anonymous_namespace)::SocketAddress>>
            (local_70,(Array<kj::(anonymous_namespace)::SocketAddress> *)local_48);
  Promise<kj::AuthenticatedStream>::
  then<kj::(anonymous_namespace)::NetworkAddressImpl::connect()::_lambda(kj::AuthenticatedStream&&)_1_>
            ((Promise<kj::AuthenticatedStream> *)this,(Type *)local_70);
  Promise<kj::AuthenticatedStream>::~Promise(local_70);
  Promise<kj::AuthenticatedStream>::~Promise((Promise<kj::AuthenticatedStream> *)local_48);
  Array<kj::(anonymous_namespace)::SocketAddress>::~Array
            ((Array<kj::(anonymous_namespace)::SocketAddress> *)local_30);
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> connect() override {
    auto addrsCopy = heapArray(addrs.asPtr());
    auto promise = connectImpl(lowLevel, filter, addrsCopy, false);
    return promise.attach(kj::mv(addrsCopy))
        .then([](AuthenticatedStream&& a) { return kj::mv(a.stream); });
  }